

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O1

bool __thiscall libtorrent::settings_pack::has_val(settings_pack *this,int name)

{
  pointer ppVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  pointer ppVar5;
  long lVar6;
  ushort uVar7;
  ulong uVar8;
  difference_type __d;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  
  uVar7 = (ushort)name;
  switch((uint)name >> 0xe & 3) {
  case 0:
    if ((long)(this->m_strings).
              super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->m_strings).
              super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x208) {
      return true;
    }
    ppVar4 = (this->m_strings).
             super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar1 = (this->m_strings).
             super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar10 = (long)ppVar1 - (long)ppVar4;
    if (0 < (long)uVar10) {
      uVar10 = (uVar10 >> 3) * -0x3333333333333333;
      do {
        uVar9 = uVar10 >> 1;
        uVar8 = uVar9;
        if (ppVar4[uVar9].first < uVar7) {
          uVar8 = ~uVar9 + uVar10;
          ppVar4 = ppVar4 + uVar9 + 1;
        }
        uVar10 = uVar8;
      } while (0 < (long)uVar8);
    }
    if (ppVar4 != ppVar1) {
      return (uint)ppVar4->first == name;
    }
    return false;
  case 1:
    ppVar2 = (this->m_ints).
             super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar5 = (this->m_ints).
             super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar6 = (long)ppVar5 - (long)ppVar2;
    if (lVar6 == 0x4f8) {
      return true;
    }
    uVar10 = lVar6 >> 3;
    while (ppVar3 = ppVar2, 0 < (long)uVar10) {
      uVar8 = uVar10 >> 1;
      uVar10 = ~uVar8 + uVar10;
      ppVar2 = ppVar3 + uVar8 + 1;
      if (uVar7 <= ppVar3[uVar8].first) {
        ppVar2 = ppVar3;
        uVar10 = uVar8;
      }
    }
    break;
  case 2:
    ppVar2 = (pointer)(this->m_bools).
                      super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    ppVar5 = (pointer)(this->m_bools).
                      super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
    lVar6 = (long)ppVar5 - (long)ppVar2;
    if (lVar6 == 0x150) {
      return true;
    }
    uVar10 = lVar6 >> 2;
    while (ppVar3 = ppVar2, 0 < (long)uVar10) {
      uVar8 = uVar10 >> 1;
      uVar10 = ~uVar8 + uVar10;
      ppVar2 = (pointer)(&ppVar3->first + uVar8 * 2 + 2);
      if (uVar7 <= (&ppVar3->first)[uVar8 * 2]) {
        ppVar2 = ppVar3;
        uVar10 = uVar8;
      }
    }
    break;
  case 3:
    goto switchD_00301095_caseD_3;
  }
  if (ppVar3 == ppVar5) {
switchD_00301095_caseD_3:
    bVar11 = false;
  }
  else {
    bVar11 = (uint)ppVar3->first == name;
  }
  return bVar11;
}

Assistant:

bool settings_pack::has_val(int const name) const
	{
		switch (name & type_mask)
		{
			case string_type_base:
			{
				// this is an optimization. If the settings pack is complete,
				// i.e. has every key, we don't need to search, it's just a lookup
				if (m_strings.size() == settings_pack::num_string_settings)
					return true;
				std::pair<std::uint16_t, std::string> v(aux::numeric_cast<std::uint16_t>(name), std::string());
				auto i = std::lower_bound(m_strings.begin(), m_strings.end(), v
						, &compare_first<std::string>);
				return i != m_strings.end() && i->first == name;
			}
			case int_type_base:
			{
				// this is an optimization. If the settings pack is complete,
				// i.e. has every key, we don't need to search, it's just a lookup
				if (m_ints.size() == settings_pack::num_int_settings)
					return true;
				std::pair<std::uint16_t, int> v(aux::numeric_cast<std::uint16_t>(name), 0);
				auto i = std::lower_bound(m_ints.begin(), m_ints.end(), v
						, &compare_first<int>);
				return i != m_ints.end() && i->first == name;
			}
			case bool_type_base:
			{
				// this is an optimization. If the settings pack is complete,
				// i.e. has every key, we don't need to search, it's just a lookup
				if (m_bools.size() == settings_pack::num_bool_settings)
					return true;
				std::pair<std::uint16_t, bool> v(aux::numeric_cast<std::uint16_t>(name), false);
				auto i = std::lower_bound(m_bools.begin(), m_bools.end(), v
						, &compare_first<bool>);
				return i != m_bools.end() && i->first == name;
			}
		}
		TORRENT_ASSERT_FAIL();
		return false;
	}